

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::AddFindDefinition(cmFindPackageCommand *this,string *var,char *val)

{
  char *pcVar1;
  mapped_type *pmVar2;
  char *old;
  char *val_local;
  string *var_local;
  cmFindPackageCommand *this_local;
  
  pcVar1 = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,var);
  if (pcVar1 == (char *)0x0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
             ::operator[](&this->OriginalDefs,var);
    pmVar2->exists = false;
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
             ::operator[](&this->OriginalDefs,var);
    pmVar2->exists = true;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
             ::operator[](&this->OriginalDefs,var);
    std::__cxx11::string::operator=((string *)&pmVar2->value,pcVar1);
  }
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,var,val);
  return;
}

Assistant:

void cmFindPackageCommand::AddFindDefinition(const std::string& var,
                                             const char* val)
{
  if(const char* old = this->Makefile->GetDefinition(var))
    {
    this->OriginalDefs[var].exists = true;
    this->OriginalDefs[var].value = old;
    }
  else
    {
    this->OriginalDefs[var].exists = false;
    }
  this->Makefile->AddDefinition(var, val);
}